

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O1

bool __thiscall
vkt::image::anon_unknown_2::BinaryAtomicIntermValuesInstance::verifyRecursive
          (BinaryAtomicIntermValuesInstance *this,deInt32 index,deInt32 valueSoFar,bool *argsUsed,
          deInt32 *atomicArgs,deInt32 *resultValues)

{
  AtomicOperation AVar1;
  bool bVar2;
  uint valueSoFar_00;
  ulong uVar3;
  bool bVar4;
  
  bVar4 = true;
  if (index < 5) {
    uVar3 = 0;
    do {
      if ((argsUsed[uVar3] == false) && (resultValues[uVar3] == valueSoFar)) {
        argsUsed[uVar3] = true;
        AVar1 = (this->super_BinaryAtomicInstanceBase).m_operation;
        if (AVar1 < ATOMIC_OPERATION_LAST) {
          valueSoFar_00 = atomicArgs[uVar3];
          switch(AVar1) {
          case ATOMIC_OPERATION_ADD:
            valueSoFar_00 = valueSoFar_00 + valueSoFar;
            break;
          case ATOMIC_OPERATION_MIN:
            if (valueSoFar < (int)valueSoFar_00) {
              valueSoFar_00 = valueSoFar;
            }
            break;
          case ATOMIC_OPERATION_MAX:
            if ((int)valueSoFar_00 < valueSoFar) {
              valueSoFar_00 = valueSoFar;
            }
            break;
          case ATOMIC_OPERATION_AND:
            valueSoFar_00 = valueSoFar_00 & valueSoFar;
            break;
          case ATOMIC_OPERATION_OR:
            valueSoFar_00 = valueSoFar_00 | valueSoFar;
            break;
          case ATOMIC_OPERATION_XOR:
            valueSoFar_00 = valueSoFar_00 ^ valueSoFar;
          }
        }
        else {
          valueSoFar_00 = 0xffffffff;
        }
        bVar2 = verifyRecursive(this,index + 1,valueSoFar_00,argsUsed,atomicArgs,resultValues);
        if (bVar2) {
          return bVar4;
        }
        argsUsed[uVar3] = false;
      }
      bVar4 = uVar3 < 4;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 5);
  }
  return bVar4;
}

Assistant:

bool BinaryAtomicIntermValuesInstance::verifyRecursive (const deInt32	index,
														const deInt32	valueSoFar,
														bool			argsUsed[NUM_INVOCATIONS_PER_PIXEL],
														const deInt32	atomicArgs[NUM_INVOCATIONS_PER_PIXEL],
														const deInt32	resultValues[NUM_INVOCATIONS_PER_PIXEL]) const
{
	if (index >= static_cast<deInt32>(NUM_INVOCATIONS_PER_PIXEL))
		return true;

	for (deInt32 i = 0; i < static_cast<deInt32>(NUM_INVOCATIONS_PER_PIXEL); i++)
	{
		if (!argsUsed[i] && resultValues[i] == valueSoFar)
		{
			argsUsed[i] = true;

			if (verifyRecursive(index + 1, computeBinaryAtomicOperationResult(m_operation, valueSoFar, atomicArgs[i]), argsUsed, atomicArgs, resultValues))
			{
				return true;
			}

			argsUsed[i] = false;
		}
	}

	return false;
}